

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeMassMatrixAndGravityForce
          (ChElementShellANCF_3833 *this)

{
  undefined1 auVar1 [16];
  pointer pLVar2;
  double *pdVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 (*pauVar4) [64];
  Index j;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  double *__s;
  ulong uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  VectorN Sxi_compact;
  type tmp;
  ChMatrixNM<double,_NSF,_NSF>_conflict2 MassMatrixCompactSquare;
  add_assign_op<double,_double> local_25c1;
  ulong local_25c0;
  double local_25b8;
  double local_25b0;
  double local_25a8;
  double local_25a0;
  double local_2598;
  double local_2590;
  double local_2588;
  double local_2580;
  double local_2578;
  plainobjectbase_evaluator_data<double,_24> local_2570;
  plainobjectbase_evaluator_data<double,_24> local_2568;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  local_2560;
  undefined1 local_2540 [128];
  undefined1 local_24c0 [64];
  double local_2480 [16];
  undefined1 local_2400 [4480];
  double local_1280 [586];
  
  __s = local_1280;
  memset(__s,0,0x1200);
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[3] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[4] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[5] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[6] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[7] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[8] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[9] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[10] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0xb] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0xc] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0xd] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0xe] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0xf] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0x10] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0x11] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0x12] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0x13] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0x14] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0x15] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0x16] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0x17] = 0.0;
  if (this->m_numLayers != 0) {
    uVar9 = 0;
    do {
      pLVar2 = (this->m_layers).
               super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar3 = &(pLVar2[uVar9].m_material.
                 super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_rho;
      this_00 = pLVar2[uVar9].m_material.
                super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_25a0 = *pdVar3;
      local_25c0 = uVar9;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (*(long *)(DAT_00b92cf0 + 0x68) != *(long *)(DAT_00b92cf0 + 0x60)) {
        local_25b8 = (this->m_layers).
                     super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar9].m_thickness;
        local_25a8 = (this->m_layer_zoffsets).
                     super__Vector_base<double,_Eigen::aligned_allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[local_25c0];
        local_25b0 = local_25b8 * 0.5 + (local_25a8 - this->m_thicknessZ * 0.5) +
                     this->m_midsurfoffset;
        uVar9 = 0;
        do {
          if (*(long *)(DAT_00b92cf0 + 0x68) != *(long *)(DAT_00b92cf0 + 0x60)) {
            uVar7 = 0;
            do {
              lVar5 = *(long *)(DAT_00b92cf0 + 0x60);
              if (*(long *)(DAT_00b92cf0 + 0x68) != lVar5) {
                uVar8 = 0;
                do {
                  lVar6 = *(long *)(static_tables_3833 + 0x60);
                  local_2578 = *(double *)(lVar6 + uVar9 * 8) * *(double *)(lVar6 + uVar7 * 8) *
                               *(double *)(lVar6 + uVar8 * 8) * local_25a0;
                  local_2590 = *(double *)(lVar5 + uVar9 * 8);
                  local_2598 = *(double *)(lVar5 + uVar7 * 8);
                  local_2588 = *(double *)(lVar5 + uVar8 * 8);
                  local_2580 = Calc_det_J_0xi(this,local_2590,local_2598,local_2588,local_25b8,
                                              local_25a8);
                  Calc_Sxi_compact(this,(VectorN *)local_2540,local_2590,local_2598,local_2588,
                                   local_25b8,local_25b0);
                  auVar15._8_8_ = 0;
                  auVar15._0_8_ = local_2580 * local_2578;
                  auVar10 = vbroadcastsd_avx512f(auVar15);
                  auVar11 = vmulpd_avx512f(auVar10,local_2540._0_64_);
                  auVar12 = vaddpd_avx512f(auVar11,*(undefined1 (*) [64])
                                                    (this->m_GravForceScale).
                                                                                                        
                                                  super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>
                                                  .m_storage.m_data.array);
                  *(undefined1 (*) [64])
                   (this->m_GravForceScale).
                   super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
                   array = auVar12;
                  auVar12 = vmulpd_avx512f(auVar10,local_2540._64_64_);
                  auVar13 = vaddpd_avx512f(auVar12,*(undefined1 (*) [64])
                                                    ((this->m_GravForceScale).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>
                                                  .m_storage.m_data.array + 8));
                  *(undefined1 (*) [64])
                   ((this->m_GravForceScale).
                    super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
                    array + 8) = auVar13;
                  auVar10 = vmulpd_avx512f(auVar10,local_24c0);
                  auVar13 = vaddpd_avx512f(auVar10,*(undefined1 (*) [64])
                                                    ((this->m_GravForceScale).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>
                                                  .m_storage.m_data.array + 0x10));
                  *(undefined1 (*) [64])
                   ((this->m_GravForceScale).
                    super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
                    array + 0x10) = auVar13;
                  pauVar4 = (undefined1 (*) [64])local_2400;
                  lVar5 = 0;
                  do {
                    auVar1._8_8_ = 0;
                    auVar1._0_8_ = *(ulong *)(local_2540 + lVar5 * 8);
                    auVar13 = vbroadcastsd_avx512f(auVar1);
                    auVar14 = vmulpd_avx512f(auVar11,auVar13);
                    pauVar4[-2] = auVar14;
                    auVar14 = vmulpd_avx512f(auVar12,auVar13);
                    pauVar4[-1] = auVar14;
                    auVar13 = vmulpd_avx512f(auVar10,auVar13);
                    *pauVar4 = auVar13;
                    lVar5 = lVar5 + 1;
                    pauVar4 = pauVar4 + 3;
                  } while (lVar5 != 0x18);
                  local_2568.data = local_2480;
                  local_2560.m_dst = (DstEvaluatorType *)&local_2570;
                  local_2560.m_src = (SrcEvaluatorType *)&local_2568;
                  local_2560.m_functor = &local_25c1;
                  local_2570.data = __s;
                  local_2560.m_dstExpr = (DstXprType *)__s;
                  Eigen::internal::
                  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_0,_1>
                  ::run(&local_2560);
                  uVar8 = (ulong)((int)uVar8 + 1);
                  lVar5 = *(long *)(DAT_00b92cf0 + 0x60);
                } while (uVar8 < (ulong)(*(long *)(DAT_00b92cf0 + 0x68) - lVar5 >> 3));
              }
              uVar7 = (ulong)((int)uVar7 + 1);
            } while (uVar7 < (ulong)(*(long *)(DAT_00b92cf0 + 0x68) - *(long *)(DAT_00b92cf0 + 0x60)
                                    >> 3));
          }
          uVar9 = (ulong)((int)uVar9 + 1);
        } while (uVar9 < (ulong)(*(long *)(DAT_00b92cf0 + 0x68) - *(long *)(DAT_00b92cf0 + 0x60) >>
                                3));
      }
      uVar9 = local_25c0 + 1;
    } while (uVar9 < (ulong)(long)this->m_numLayers);
  }
  lVar5 = 0;
  uVar9 = 0;
  do {
    uVar7 = uVar9;
    if ((uint)uVar9 < 0x12d) {
      uVar7 = 300;
    }
    lVar6 = 0;
    do {
      if (uVar7 - uVar9 == lVar6) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 300, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 300, 1>, Level = 1]"
                     );
      }
      (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
      m_storage.m_data.array[uVar9 + lVar6] = __s[lVar6];
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 + (int)lVar5 != 0x18);
    lVar5 = lVar5 + 1;
    __s = __s + 0x19;
    uVar9 = (ulong)((uint)uVar9 + (int)lVar6);
  } while (lVar5 != 0x18);
  return;
}

Assistant:

void ChElementShellANCF_3833::ComputeMassMatrixAndGravityForce() {
    // For this element, the mass matrix integrand is of order 9 in xi, 9 in eta, and 9 in zeta.
    // 5 GQ Points are needed in the xi, eta, and zeta directions for exact integration of the element's mass matrix,
    // even if the reference configuration is not straight. Since the major pieces of the generalized force due to
    // gravity can also be used to calculate the mass matrix, these calculations are performed at the same time.  Only
    // the matrix that scales the acceleration due to gravity is calculated at this time so that any changes to the
    // acceleration due to gravity in the system are correctly accounted for in the generalized internal force
    // calculation.

    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi_eta = 4;  // 5 Point Gauss-Quadrature;
    unsigned int GQ_idx_zeta = 4;    // 5 Point Gauss-Quadrature;

    // Mass Matrix in its compact matrix form.  Since the mass matrix is symmetric, just the upper diagonal entries will
    // be stored.
    ChMatrixNM<double, NSF, NSF> MassMatrixCompactSquare;

    // Set these to zeros since they will be incremented as the vector/matrix is calculated
    MassMatrixCompactSquare.setZero();
    m_GravForceScale.setZero();

    for (size_t kl = 0; kl < m_numLayers; kl++) {
        double rho = m_layers[kl].GetMaterial()->Get_rho();  // Density of the material for the current layer
        double thickness = m_layers[kl].Get_thickness();
        double zoffset = m_layer_zoffsets[kl];
        double layer_midsurface_offset =
            -m_thicknessZ / 2 + m_layer_zoffsets[kl] + m_layers[kl].Get_thickness() / 2 + m_midsurfoffset;

        // Sum the contribution to the mass matrix and generalized force due to gravity at the current point
        for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi_eta].size(); it_xi++) {
            for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_xi_eta].size(); it_eta++) {
                for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_zeta].size(); it_zeta++) {
                    double GQ_weight = GQTable->Weight[GQ_idx_xi_eta][it_xi] * GQTable->Weight[GQ_idx_xi_eta][it_eta] *
                                       GQTable->Weight[GQ_idx_zeta][it_zeta];
                    double xi = GQTable->Lroots[GQ_idx_xi_eta][it_xi];
                    double eta = GQTable->Lroots[GQ_idx_xi_eta][it_eta];
                    double zeta = GQTable->Lroots[GQ_idx_zeta][it_zeta];
                    double det_J_0xi = Calc_det_J_0xi(xi, eta, zeta, thickness,
                                                      zoffset);  // determinant of the element Jacobian (volume ratio)

                    VectorN Sxi_compact;  // Vector of the Unique Normalized Shape Functions
                    Calc_Sxi_compact(Sxi_compact, xi, eta, zeta, thickness, layer_midsurface_offset);

                    m_GravForceScale += (GQ_weight * rho * det_J_0xi) * Sxi_compact;
                    MassMatrixCompactSquare += (GQ_weight * rho * det_J_0xi) * Sxi_compact * Sxi_compact.transpose();
                }
            }
        }
    }

    // Store just the unique entries in the Mass Matrix in Compact Upper Triangular Form
    // since the full Mass Matrix is both sparse and symmetric
    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            m_MassMatrix(idx) = MassMatrixCompactSquare(i, j);
            idx++;
        }
    }
}